

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O3

void __thiscall Satyricon::Literal_Heap::heapify(Literal_Heap *this,size_type i)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  pointer pLVar7;
  pointer piVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  
  pvVar6 = this->activity;
  pLVar7 = (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->value).
                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)pLVar7 >> 2;
  piVar8 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar2 = i * 2 + 1;
    uVar11 = i;
    if ((uVar2 < uVar10) &&
       (pdVar9 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start, dVar3 = pdVar9[(uint)pLVar7[uVar2].value],
       pdVar1 = pdVar9 + (uint)pLVar7[i].value, *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
      uVar11 = uVar2;
    }
    uVar2 = i * 2 + 2;
    if ((uVar2 < uVar10) &&
       (pdVar9 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start, dVar3 = pdVar9[(uint)pLVar7[i * 2 + 2].value],
       pdVar1 = pdVar9 + (uint)pLVar7[uVar11].value, *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
      uVar11 = uVar2;
    }
    if (uVar11 == i) break;
    uVar4 = pLVar7[i].value;
    pLVar7[i].value = pLVar7[uVar11].value;
    pLVar7[uVar11].value = uVar4;
    iVar5 = piVar8[(uint)pLVar7[i].value];
    piVar8[(uint)pLVar7[i].value] = piVar8[uVar4];
    piVar8[uVar4] = iVar5;
    i = uVar11;
  }
  return;
}

Assistant:

void heapify(size_type i) {
        //std::cout <<"heapify " << i << " " << left(i) << " " << right(i) << std::endl;
        auto largest = i;
        if (left(i) < value.size()  && activity[value[largest].index()] < activity[value[left(i)].index()] )
            largest = left(i);
        if (right(i) < value.size()  && activity[value[largest].index()] < activity[value[right(i)].index()] )
            largest = right(i);

        if ( largest != i ) {
            std::swap(value[i],value[largest]);
            std::swap(map_position[value[i].index()],
                    map_position[value[largest].index()]);

            heapify(largest);
        }
    }